

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

void event_base_free_(event_base *base,int run_finalizers)

{
  long *plVar1;
  event *peVar2;
  common_timeout_list **ptr;
  common_timeout_list *ptr_00;
  event_callback *peVar3;
  event_once **ppeVar4;
  event_once *ptr_01;
  _func_void_event_base_ptr *p_Var5;
  event **ptr_02;
  int iVar6;
  int iVar7;
  ulong uVar8;
  event_once *peVar9;
  ulong uVar10;
  undefined8 uVar11;
  event_base *base_00;
  event_callback *peVar12;
  char *pcVar13;
  int i;
  event *ev;
  int deleted;
  long lVar14;
  uint uVar15;
  
  base_00 = event_global_current_base_;
  if (event_global_current_base_ == (event_base *)0x0) {
    base_00 = base;
  }
  if (base != (event_base *)0x0) {
    base_00 = base;
  }
  if (base_00 == (event_base *)0x0) {
    event_warnx("%s: no base to free","event_base_free_");
    return;
  }
  if (base_00->th_notify_fd[0] != -1) {
    event_del(&base_00->th_notify);
    evutil_closesocket(base_00->th_notify_fd[0]);
    if (base_00->th_notify_fd[1] != -1) {
      evutil_closesocket(base_00->th_notify_fd[1]);
    }
    base_00->th_notify_fd[0] = -1;
    base_00->th_notify_fd[1] = -1;
    event_debug_unassign(&base_00->th_notify);
  }
  evmap_delete_all_(base_00);
  uVar15 = 0;
  while (((base_00->timeheap).n != 0 && (peVar2 = *(base_00->timeheap).p, peVar2 != (event *)0x0)))
  {
    event_del(peVar2);
    uVar15 = uVar15 + 1;
  }
  for (lVar14 = 0; ptr = base_00->common_timeout_queues, lVar14 < base_00->n_common_timeouts;
      lVar14 = lVar14 + 1) {
    ptr_00 = ptr[lVar14];
    event_del(&ptr_00->timeout_event);
    event_debug_unassign(&ptr_00->timeout_event);
    peVar2 = (ptr_00->events).tqh_first;
    while (ev = peVar2, ev != (event *)0x0) {
      peVar2 = (ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_next;
      if (((ev->ev_evcallback).evcb_flags & 0x10) == 0) {
        event_del(ev);
        uVar15 = uVar15 + 1;
      }
    }
    event_mm_free_(ptr_00);
  }
  if (ptr != (common_timeout_list **)0x0) {
    event_mm_free_(ptr);
  }
  do {
    uVar8 = 0;
    for (lVar14 = 0; lVar14 < base_00->nactivequeues; lVar14 = lVar14 + 1) {
      peVar12 = base_00->activequeues[lVar14].tqh_first;
      while (peVar12 != (event_callback *)0x0) {
        peVar3 = (peVar12->evcb_active_next).tqe_next;
        iVar6 = event_base_cancel_single_callback_(base_00,peVar12,run_finalizers);
        uVar8 = (ulong)(uint)((int)uVar8 + iVar6);
        peVar12 = peVar3;
      }
    }
    while( true ) {
      peVar12 = (base_00->active_later_queue).tqh_first;
      iVar6 = (int)uVar8;
      if (peVar12 == (event_callback *)0x0) break;
      iVar7 = event_base_cancel_single_callback_(base_00,peVar12,run_finalizers);
      uVar8 = (ulong)(uint)(iVar6 + iVar7);
    }
    if (event_debug_logging_mask_ != 0) {
      event_debugx_("%s: %d events freed","event_base_free_",uVar8);
    }
    uVar15 = uVar15 + iVar6;
  } while (iVar6 != 0);
  if ((uVar15 != 0) && (event_debug_logging_mask_ != 0)) {
    event_debugx_("%s: %d events were still set in base","event_base_free_",(ulong)uVar15);
  }
  while (ptr_01 = (base_00->once_events).lh_first, ptr_01 != (event_once *)0x0) {
    peVar9 = (ptr_01->next_once).le_next;
    ppeVar4 = (ptr_01->next_once).le_prev;
    if (peVar9 == (event_once *)0x0) {
      peVar9 = (event_once *)0x0;
    }
    else {
      (peVar9->next_once).le_prev = ppeVar4;
      peVar9 = (ptr_01->next_once).le_next;
    }
    *ppeVar4 = peVar9;
    event_mm_free_(ptr_01);
  }
  if ((base_00->evsel != (eventop *)0x0) &&
     (p_Var5 = base_00->evsel->dealloc, p_Var5 != (_func_void_event_base_ptr *)0x0)) {
    (*p_Var5)(base_00);
  }
  uVar8 = (ulong)(uint)base_00->nactivequeues;
  if (base_00->nactivequeues < 1) {
    uVar8 = 0;
  }
  uVar10 = 0;
  do {
    if (uVar8 * 0x10 + 0x10 == uVar10 + 0x10) {
      if ((base_00->timeheap).n == 0) {
        ptr_02 = (base_00->timeheap).p;
        if (ptr_02 != (event **)0x0) {
          event_mm_free_(ptr_02);
        }
        event_mm_free_(base_00->activequeues);
        evmap_io_clear_(&base_00->io);
        evmap_signal_clear_(&base_00->sigmap);
        event_changelist_freemem_(&base_00->changelist);
        if (evthread_lock_fns_.free != (_func_void_void_ptr_uint *)0x0 &&
            base_00->th_base_lock != (void *)0x0) {
          (*evthread_lock_fns_.free)(base_00->th_base_lock,0);
        }
        if (base_00->current_event_cond != (void *)0x0) {
          (*evthread_cond_fns_.free_condition)(base_00->current_event_cond);
        }
        if (base_00 == event_global_current_base_) {
          event_global_current_base_ = (event_base *)0x0;
        }
        event_mm_free_(base_00);
        return;
      }
      pcVar13 = "min_heap_empty_(&base->timeheap)";
      uVar11 = 0x3a2;
      goto LAB_001f4ad6;
    }
    plVar1 = (long *)((long)&base_00->activequeues->tqh_first + uVar10);
    uVar10 = uVar10 + 0x10;
  } while (*plVar1 == 0);
  pcVar13 = "TAILQ_EMPTY(&base->activequeues[i])";
  uVar11 = 0x3a0;
LAB_001f4ad6:
  event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
             ,uVar11,pcVar13,"event_base_free_");
}

Assistant:

static void
event_base_free_(struct event_base *base, int run_finalizers)
{
	int i, n_deleted=0;
	struct event *ev;
	/* XXXX grab the lock? If there is contention when one thread frees
	 * the base, then the contending thread will be very sad soon. */

	/* event_base_free(NULL) is how to free the current_base if we
	 * made it with event_init and forgot to hold a reference to it. */
	if (base == NULL && current_base)
		base = current_base;
	/* Don't actually free NULL. */
	if (base == NULL) {
		event_warnx("%s: no base to free", __func__);
		return;
	}
	/* XXX(niels) - check for internal events first */

#ifdef _WIN32
	event_base_stop_iocp_(base);
#endif

	/* threading fds if we have them */
	if (base->th_notify_fd[0] != -1) {
		event_del(&base->th_notify);
		EVUTIL_CLOSESOCKET(base->th_notify_fd[0]);
		if (base->th_notify_fd[1] != -1)
			EVUTIL_CLOSESOCKET(base->th_notify_fd[1]);
		base->th_notify_fd[0] = -1;
		base->th_notify_fd[1] = -1;
		event_debug_unassign(&base->th_notify);
	}

	/* Delete all non-internal events. */
	evmap_delete_all_(base);

	while ((ev = min_heap_top_(&base->timeheap)) != NULL) {
		event_del(ev);
		++n_deleted;
	}
	for (i = 0; i < base->n_common_timeouts; ++i) {
		struct common_timeout_list *ctl =
		    base->common_timeout_queues[i];
		event_del(&ctl->timeout_event); /* Internal; doesn't count */
		event_debug_unassign(&ctl->timeout_event);
		for (ev = TAILQ_FIRST(&ctl->events); ev; ) {
			struct event *next = TAILQ_NEXT(ev,
			    ev_timeout_pos.ev_next_with_common_timeout);
			if (!(ev->ev_flags & EVLIST_INTERNAL)) {
				event_del(ev);
				++n_deleted;
			}
			ev = next;
		}
		mm_free(ctl);
	}
	if (base->common_timeout_queues)
		mm_free(base->common_timeout_queues);

	for (;;) {
		/* For finalizers we can register yet another finalizer out from
		 * finalizer, and iff finalizer will be in active_later_queue we can
		 * add finalizer to activequeues, and we will have events in
		 * activequeues after this function returns, which is not what we want
		 * (we even have an assertion for this).
		 *
		 * A simple case is bufferevent with underlying (i.e. filters).
		 */
		int i = event_base_free_queues_(base, run_finalizers);
		event_debug(("%s: %d events freed", __func__, i));
		if (!i) {
			break;
		}
		n_deleted += i;
	}

	if (n_deleted)
		event_debug(("%s: %d events were still set in base",
			__func__, n_deleted));

	while (LIST_FIRST(&base->once_events)) {
		struct event_once *eonce = LIST_FIRST(&base->once_events);
		LIST_REMOVE(eonce, next_once);
		mm_free(eonce);
	}

	if (base->evsel != NULL && base->evsel->dealloc != NULL)
		base->evsel->dealloc(base);

	for (i = 0; i < base->nactivequeues; ++i)
		EVUTIL_ASSERT(TAILQ_EMPTY(&base->activequeues[i]));

	EVUTIL_ASSERT(min_heap_empty_(&base->timeheap));
	min_heap_dtor_(&base->timeheap);

	mm_free(base->activequeues);

	evmap_io_clear_(&base->io);
	evmap_signal_clear_(&base->sigmap);
	event_changelist_freemem_(&base->changelist);

	EVTHREAD_FREE_LOCK(base->th_base_lock, 0);
	EVTHREAD_FREE_COND(base->current_event_cond);

	/* If we're freeing current_base, there won't be a current_base. */
	if (base == current_base)
		current_base = NULL;
	mm_free(base);
}